

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

bool __thiscall
Js::DebuggerScope::IsAncestorOf(DebuggerScope *this,DebuggerScope *potentialChildScope)

{
  DebuggerScope *pDVar1;
  DebuggerScope *local_28;
  DebuggerScope *currentScope;
  DebuggerScope *potentialChildScope_local;
  DebuggerScope *this_local;
  
  local_28 = potentialChildScope;
  if (potentialChildScope != (DebuggerScope *)0x0) {
    for (; local_28 != (DebuggerScope *)0x0; local_28 = GetParentScope(local_28)) {
      pDVar1 = GetParentScope(local_28);
      if (pDVar1 == this) {
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool DebuggerScope::IsAncestorOf(const DebuggerScope* potentialChildScope)
    {
        if (potentialChildScope == nullptr)
        {
            // If the child scope is null, it represents the global scope which
            // cannot be a child of anything.
            return false;
        }

        const DebuggerScope* currentScope = potentialChildScope;
        while (currentScope)
        {
            if (currentScope->GetParentScope() == this)
            {
                return true;
            }

            currentScope = currentScope->GetParentScope();
        }

        return false;
    }